

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void clone_mobile(CHAR_DATA *parent,CHAR_DATA *clone)

{
  bool bVar1;
  int nIndex;
  char *pcVar2;
  CClass *pCVar3;
  long lVar4;
  AFFECT_DATA *paf;
  
  if ((clone != (CHAR_DATA *)0x0 && parent != (CHAR_DATA *)0x0) && (bVar1 = is_npc(parent), bVar1))
  {
    pcVar2 = palloc_string(parent->name);
    clone->name = pcVar2;
    clone->version = parent->version;
    pcVar2 = palloc_string(parent->short_descr);
    clone->short_descr = pcVar2;
    pcVar2 = palloc_string(parent->long_descr);
    clone->long_descr = pcVar2;
    pcVar2 = palloc_string(parent->description);
    clone->description = pcVar2;
    clone->group = parent->group;
    clone->sex = parent->sex;
    pCVar3 = parent->my_class;
    if ((pCVar3 == (CClass *)0x0) &&
       ((parent->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar3 = parent->pIndexData->my_class, pCVar3 == (CClass *)0x0)))) {
      pCVar3 = CClass::GetClass(0);
    }
    nIndex = CClass::GetIndex(pCVar3);
    pCVar3 = CClass::GetClass(nIndex);
    clone->my_class = pCVar3;
    clone->race = parent->race;
    clone->level = parent->level;
    clone->trust = 0;
    clone->timer = parent->timer;
    clone->wait = parent->wait;
    clone->hit = parent->hit;
    clone->max_hit = parent->max_hit;
    clone->mana = parent->mana;
    clone->max_mana = parent->max_mana;
    clone->move = parent->move;
    clone->max_move = parent->max_move;
    clone->gold = parent->gold;
    clone->exp = parent->exp;
    copy_vector(clone->act,parent->act);
    copy_vector(clone->comm,parent->comm);
    copy_vector(clone->imm_flags,parent->imm_flags);
    copy_vector(clone->res_flags,parent->res_flags);
    copy_vector(clone->vuln_flags,parent->vuln_flags);
    clone->invis_level = parent->invis_level;
    copy_vector(clone->affected_by,parent->affected_by);
    clone->position = parent->position;
    clone->practice = parent->practice;
    clone->train = parent->train;
    clone->saving_throw = parent->saving_throw;
    clone->alignment = parent->alignment;
    clone->hitroll = parent->hitroll;
    clone->damroll = parent->damroll;
    clone->wimpy = parent->wimpy;
    copy_vector(clone->form,parent->form);
    copy_vector(clone->parts,parent->parts);
    clone->size = parent->size;
    copy_vector(clone->off_flags,parent->off_flags);
    clone->dam_type = parent->dam_type;
    clone->start_pos = parent->start_pos;
    clone->dam_mod = parent->dam_mod;
    clone->defense_mod = parent->defense_mod;
    clone->cabal = parent->cabal;
    clone->arms = parent->arms;
    clone->legs = parent->legs;
    lVar4 = 0x105;
    do {
      *(undefined2 *)((long)&clone->next + lVar4 * 2) =
           *(undefined2 *)((long)&parent->next + lVar4 * 2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x109);
    lVar4 = 0x134;
    do {
      *(undefined2 *)((long)&clone->next + lVar4 * 2) =
           *(undefined2 *)((long)&parent->next + lVar4 * 2);
      *(undefined2 *)((long)&clone->next_in_room + lVar4 * 2 + 2) =
           *(undefined2 *)((long)&parent->next_in_room + lVar4 * 2 + 2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x139);
    lVar4 = 0x168;
    do {
      *(undefined2 *)((long)&clone->next + lVar4 * 2) =
           *(undefined2 *)((long)&parent->next + lVar4 * 2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x16b);
    for (paf = parent->affected; paf != (AFFECT_DATA *)0x0; paf = paf->next) {
      affect_to_char(clone,paf);
    }
  }
  return;
}

Assistant:

void clone_mobile(CHAR_DATA *parent, CHAR_DATA *clone)
{
	int i;
	AFFECT_DATA *paf;

	if (parent == nullptr || clone == nullptr || !is_npc(parent))
		return;

	/* start fixing values */
	clone->name = palloc_string(parent->name);
	clone->version = parent->version;
	clone->short_descr = palloc_string(parent->short_descr);
	clone->long_descr = palloc_string(parent->long_descr);
	clone->description = palloc_string(parent->description);
	clone->group = parent->group;
	clone->sex = parent->sex;
	clone->SetClass(parent->Class()->GetIndex());
	clone->race = parent->race;
	clone->level = parent->level;
	clone->trust = 0;
	clone->timer = parent->timer;
	clone->wait = parent->wait;
	clone->hit = parent->hit;
	clone->max_hit = parent->max_hit;
	clone->mana = parent->mana;
	clone->max_mana = parent->max_mana;
	clone->move = parent->move;
	clone->max_move = parent->max_move;
	clone->gold = parent->gold;
	clone->exp = parent->exp;

	copy_vector(clone->act, parent->act);
	copy_vector(clone->comm, parent->comm);
	copy_vector(clone->imm_flags, parent->imm_flags);
	copy_vector(clone->res_flags, parent->res_flags);
	copy_vector(clone->vuln_flags, parent->vuln_flags);

	clone->invis_level = parent->invis_level;

	copy_vector(clone->affected_by, parent->affected_by);

	clone->position = parent->position;
	clone->practice = parent->practice;
	clone->train = parent->train;
	clone->saving_throw = parent->saving_throw;
	clone->alignment = parent->alignment;
	clone->hitroll = parent->hitroll;
	clone->damroll = parent->damroll;
	clone->wimpy = parent->wimpy;

	copy_vector(clone->form, parent->form);
	copy_vector(clone->parts, parent->parts);

	clone->size = parent->size;

	copy_vector(clone->off_flags, parent->off_flags);

	clone->dam_type = parent->dam_type;
	clone->start_pos = parent->start_pos;
	clone->dam_mod = parent->dam_mod;
	clone->defense_mod = parent->defense_mod;
	clone->cabal = parent->cabal;
	clone->arms = parent->arms;
	clone->legs = parent->legs;

	for (i = 0; i < 4; i++)
	{
		clone->armor[i] = parent->armor[i];
	}

	for (i = 0; i < MAX_STATS; i++)
	{
		clone->perm_stat[i] = parent->perm_stat[i];
		clone->mod_stat[i] = parent->mod_stat[i];
	}

	for (i = 0; i < 3; i++)
	{
		clone->damage[i] = parent->damage[i];
	}

	/* now add the affects */
	for (paf = parent->affected; paf != nullptr; paf = paf->next)
	{
		affect_to_char(clone, paf);
	}
}